

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmEval.cpp
# Opt level: O0

bool StoreFrameValue(InstructionVMEvalContext *ctx,VmConstant *pointer,int offset,VmConstant *value,
                    uint storeSize)

{
  SynIdentifier *pSVar1;
  long lVar2;
  VmConstant *ctx_00;
  bool bVar3;
  uint offset_00;
  uint uVar4;
  undefined1 auStack_50 [4];
  uint location;
  InplaceStr functionName;
  Storage *target;
  uint base;
  uint storeSize_local;
  VmConstant *value_local;
  VmConstant *pVStack_20;
  int offset_local;
  VmConstant *pointer_local;
  InstructionVMEvalContext *ctx_local;
  
  target._0_4_ = 0;
  target._4_4_ = storeSize;
  _base = value;
  value_local._4_4_ = offset;
  pVStack_20 = pointer;
  pointer_local = (VmConstant *)ctx;
  functionName.end = (char *)FindTarget(ctx,pointer,(uint *)&target);
  if ((Storage *)functionName.end == (Storage *)0x0) {
    if (((pointer_local->super_VmValue).type.size & 1) == 0) {
      __assert_fail("ctx.hasError",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVmEval.cpp"
                    ,0x260,
                    "bool StoreFrameValue(InstructionVMEvalContext &, VmConstant *, int, VmConstant *, unsigned int)"
                   );
    }
    ctx_local._7_1_ = false;
  }
  else {
    if ((*(byte *)((long)pointer_local[3].super_VmValue.users.little + 0x39) & 1) != 0) {
      if ((((Storage *)functionName.end)->functionOwner == (VmFunction *)0x0) ||
         (((Storage *)functionName.end)->functionOwner->function == (FunctionData *)0x0)) {
        InplaceStr::InplaceStr((InplaceStr *)auStack_50,"---");
      }
      else {
        pSVar1 = ((Storage *)functionName.end)->functionOwner->function->name;
        _auStack_50 = (pSVar1->name).begin;
        functionName.begin = (pSVar1->name).end;
      }
      printf("      StoreFrameValue %.*s [%s] @ %04x + %02x [%02x]\n",
             (ulong)(uint)((int)functionName.begin - (int)_auStack_50),_auStack_50,
             *(undefined8 *)(functionName.end + 8),(ulong)(uint)target,
             (ulong)(pVStack_20->iValue & 0xffff),target._4_4_);
    }
    offset_00 = value_local._4_4_ + (pVStack_20->iValue & 0xffffU) + (uint)target;
    bVar3 = InstructionVMEvalContext::Storage::Reserve
                      ((Storage *)functionName.end,(InstructionVMEvalContext *)pointer_local,
                       offset_00,(_base->super_VmValue).type.size);
    ctx_00 = pointer_local;
    if (bVar3) {
      lVar2 = *(long *)(functionName.end + 0x18);
      uVar4 = SmallArray<char,_128U>::size((SmallArray<char,_128U> *)(functionName.end + 0x18));
      CopyConstantRaw((InstructionVMEvalContext *)ctx_00,(char *)(lVar2 + (ulong)offset_00),
                      uVar4 - offset_00,_base,target._4_4_);
      ctx_local._7_1_ = true;
    }
    else {
      anon_unknown.dwarf_1b3692::Report
                ((InstructionVMEvalContext *)pointer_local,"ERROR: out of stack space");
      ctx_local._7_1_ = false;
    }
  }
  return ctx_local._7_1_;
}

Assistant:

bool StoreFrameValue(InstructionVMEvalContext &ctx, VmConstant *pointer, int offset, VmConstant *value, unsigned storeSize)
{
	unsigned base = 0;

	if(InstructionVMEvalContext::Storage *target = FindTarget(ctx, pointer, base))
	{
		if(ctx.printExecution)
		{
			InplaceStr functionName = target->functionOwner && target->functionOwner->function ? target->functionOwner->function->name->name : InplaceStr("---");

			printf("      StoreFrameValue %.*s [%s] @ %04x + %02x [%02x]\n", FMT_ISTR(functionName), target->tag, base, pointer->iValue & memoryOffsetMask, storeSize);
		}

		unsigned location = (pointer->iValue & memoryOffsetMask) + base;

		location += offset;

		if(!target->Reserve(ctx, location, value->type.size))
		{
			Report(ctx, "ERROR: out of stack space");
			return false;
		}

		CopyConstantRaw(ctx, target->data.data + location, target->data.size() - location, value, storeSize);

		return true;
	}

	assert(ctx.hasError);

	return false;
}